

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O2

void __thiscall bloaty::ReadEhFrame(bloaty *this,string_view data,RangeSink *sink)

{
  __node_base _Var1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  __node_ptr p_Var6;
  uint64_t uVar7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  __hash_code __code;
  __hash_code __c;
  _Hash_node_base _Var9;
  ulong uVar10;
  size_type __n;
  ulong uVar11;
  char *pcVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  string_view sVar15;
  __buckets_alloc_type __alloc;
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  cie_map;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  RangeSink *local_88;
  _Scoped_node local_80;
  string_view local_70;
  size_t local_60;
  char *local_58;
  char *local_50;
  string_view entry;
  CompilationUnitSizes sizes;
  
  local_88 = (RangeSink *)data._M_str;
  local_70._M_str = (char *)data._M_len;
  cie_map._M_h._M_buckets = &cie_map._M_h._M_single_bucket;
  cie_map._M_h._M_bucket_count = 1;
  cie_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  cie_map._M_h._M_element_count = 0;
  cie_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  cie_map._M_h._M_rehash_policy._M_next_resize = 0;
  cie_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_70._M_len = (size_t)this;
  while ((bloaty *)local_70._M_len != (bloaty *)0x0) {
    local_98._M_str = local_70._M_str;
    local_98._M_len = local_70._M_len;
    entry = dwarf::CompilationUnitSizes::ReadInitialLength(&sizes,&local_70);
    __c = entry._M_len | local_70._M_len;
    if (__c == 0) break;
    local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_98,0,
                          (size_type)(entry._M_str + (entry._M_len - (long)local_98._M_str)));
    uVar4 = ReadFixed<unsigned_int,4ul>(&entry);
    if (uVar4 == 0) {
      pcVar12 = local_98._M_str;
      local_50 = local_98._M_str;
      uVar10 = (ulong)local_98._M_str % cie_map._M_h._M_bucket_count;
      p_Var6 = std::
               _Hashtable<const_void_*,_std::pair<const_void_*const,_CIEInfo>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_node(&cie_map._M_h,uVar10,&local_50,__c);
      if (p_Var6 == (__node_ptr)0x0) {
        local_80._M_h = (__hashtable_alloc *)&cie_map;
        p_Var6 = (__node_ptr)operator_new(0x30);
        (p_Var6->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
        local_58 = pcVar12;
        *(char **)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                   super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage.
                   _M_storage = pcVar12;
        *(undefined8 *)
         ((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                 super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage.
                 _M_storage + 8) = 0;
        *(undefined8 *)
         ((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                 super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage.
                 _M_storage + 0x10) = 0;
        *(undefined8 *)
         ((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                 super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage.
                 _M_storage + 0x18) = 0;
        *(undefined8 *)
         ((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                 super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage.
                 _M_storage + 0x20) = 0;
        local_60 = cie_map._M_h._M_rehash_policy._M_next_resize;
        local_80._M_node = p_Var6;
        auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                            ((ulong)&cie_map._M_h._M_rehash_policy,cie_map._M_h._M_bucket_count,
                             cie_map._M_h._M_element_count);
        __n = auVar14._8_8_;
        if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__n == 1) {
            cie_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
            __s = &cie_map._M_h._M_single_bucket;
          }
          else {
            __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                            (&__alloc,__n);
            memset(__s,0,__n * 8);
          }
          _Var1._M_nxt = cie_map._M_h._M_before_begin._M_nxt;
          cie_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          uVar10 = 0;
LAB_00194a9f:
          uVar11 = uVar10;
          _Var9._M_nxt = _Var1._M_nxt;
          if (_Var9._M_nxt != (_Hash_node_base *)0x0) {
            _Var1._M_nxt = (_Var9._M_nxt)->_M_nxt;
            uVar10 = (ulong)_Var9._M_nxt[1]._M_nxt % __n;
            if (__s[uVar10] == (_Hash_node_base *)0x0) goto LAB_00194ace;
            (_Var9._M_nxt)->_M_nxt = __s[uVar10]->_M_nxt;
            pp_Var8 = &__s[uVar10]->_M_nxt;
            uVar10 = uVar11;
            goto LAB_00194aee;
          }
          std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_CIEInfo>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_deallocate_buckets(&cie_map._M_h);
          uVar10 = (ulong)local_58 % __n;
          cie_map._M_h._M_buckets = __s;
          cie_map._M_h._M_bucket_count = __n;
        }
        if (cie_map._M_h._M_buckets[uVar10] == (__node_base_ptr)0x0) {
          (p_Var6->super__Hash_node_base)._M_nxt = cie_map._M_h._M_before_begin._M_nxt;
          if (cie_map._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            cie_map._M_h._M_buckets
            [(ulong)cie_map._M_h._M_before_begin._M_nxt[1]._M_nxt % cie_map._M_h._M_bucket_count] =
                 (__node_base_ptr)p_Var6;
          }
          cie_map._M_h._M_buckets[uVar10] = &cie_map._M_h._M_before_begin;
          cie_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var6;
        }
        else {
          (p_Var6->super__Hash_node_base)._M_nxt = cie_map._M_h._M_buckets[uVar10]->_M_nxt;
          cie_map._M_h._M_buckets[uVar10]->_M_nxt = (_Hash_node_base *)p_Var6;
        }
        cie_map._M_h._M_element_count = cie_map._M_h._M_element_count + 1;
        local_80._M_node = (__node_ptr)0x0;
        std::
        _Hashtable<const_void_*,_std::pair<const_void_*const,_CIEInfo>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_Scoped_node::~_Scoped_node(&local_80);
      }
      bVar2 = ReadFixed<unsigned_char,1ul>(&entry);
      *(uint *)((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>
                       ).super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>.
                       _M_storage._M_storage + 8) = (uint)bVar2;
      sVar15 = ReadNullTerminated(&entry);
      uVar4 = dwarf::ReadLEB128<unsigned_int>(&entry);
      *(uint *)((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>
                       ).super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>.
                       _M_storage._M_storage + 0xc) = uVar4;
      iVar5 = dwarf::ReadLEB128<int>(&entry);
      *(int *)((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>)
                      .super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>.
                      _M_storage._M_storage + 0x10) = iVar5;
      iVar5 = *(int *)((long)&(p_Var6->
                              super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                              super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>.
                              _M_storage._M_storage + 8);
      if (iVar5 == 1) {
        bVar2 = ReadFixed<unsigned_char,1ul>(&entry);
        uVar4 = (uint)bVar2;
      }
      else {
        if (iVar5 != 3) {
          iVar5 = 0xa8;
          pcVar12 = "Unexpected eh_frame CIE version";
LAB_00194ca0:
          Throw(pcVar12,iVar5);
        }
        uVar4 = dwarf::ReadLEB128<unsigned_int>(&entry);
      }
      *(uint *)((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>
                       ).super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>.
                       _M_storage._M_storage + 0x20) = uVar4;
      for (sVar13 = 0; sVar15._M_len != sVar13; sVar13 = sVar13 + 1) {
        switch(sVar15._M_str[sVar13]) {
        case 'L':
          uVar3 = ReadFixed<unsigned_char,1ul>(&entry);
          (p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
          super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage._M_storage.
          __data[0x15] = uVar3;
          break;
        case 'M':
        case 'N':
        case 'O':
        case 'Q':
switchD_00194c01_caseD_4d:
          iVar5 = 0xc1;
          pcVar12 = "Unexepcted augmentation character";
          goto LAB_00194ca0;
        case 'P':
          uVar3 = ReadFixed<unsigned_char,1ul>(&entry);
          uVar7 = ReadEncodedPointer(uVar3,true,&entry,(char *)0x0,local_88);
          *(uint64_t *)
           ((long)&(p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
                   super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage.
                   _M_storage + 0x18) = uVar7;
          break;
        case 'R':
          uVar3 = ReadFixed<unsigned_char,1ul>(&entry);
          (p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
          super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage._M_storage.
          __data[0x14] = uVar3;
          break;
        case 'S':
          (p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
          super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage._M_storage.
          __data[0x16] = '\x01';
          break;
        default:
          if (sVar15._M_str[sVar13] != 'z') goto switchD_00194c01_caseD_4d;
          (p_Var6->super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>).
          super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>._M_storage._M_storage.
          __data[0x17] = '\x01';
          dwarf::ReadLEB128<unsigned_int>(&entry);
        }
      }
    }
    else {
      local_80._M_h = (__hashtable_alloc *)(entry._M_str + (-4 - (ulong)uVar4));
      p_Var6 = std::
               _Hashtable<const_void_*,_std::pair<const_void_*const,_CIEInfo>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_node(&cie_map._M_h,(ulong)local_80._M_h % cie_map._M_h._M_bucket_count,
                              &local_80._M_h,(__hash_code)local_80._M_h);
      if (p_Var6 == (__node_ptr)0x0) {
        Throw("Couldn\'t find CIE for FDE",200);
      }
      uVar7 = ReadEncodedPointer((p_Var6->
                                 super__Hash_node_value<std::pair<const_void_*const,_CIEInfo>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_void_*const,_CIEInfo>_>
                                 ._M_storage._M_storage.__data[0x14],true,&entry,(char *)0x0,
                                 local_88);
      RangeSink::AddFileRangeForVMAddr(local_88,"dwarf_fde",uVar7,local_98);
    }
  }
  std::
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  ::~unordered_map(&cie_map);
  return;
LAB_00194ace:
  (_Var9._M_nxt)->_M_nxt = cie_map._M_h._M_before_begin._M_nxt;
  __s[uVar10] = &cie_map._M_h._M_before_begin;
  cie_map._M_h._M_before_begin._M_nxt = _Var9._M_nxt;
  if ((_Var9._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var8 = __s + uVar11;
LAB_00194aee:
    *pp_Var8 = _Var9._M_nxt;
  }
  goto LAB_00194a9f;
}

Assistant:

void ReadEhFrame(string_view data, RangeSink* sink) {
  string_view remaining = data;

  struct CIEInfo {
    int version = 0;
    uint32_t code_align = 0;
    int32_t data_align = 0;
    uint8_t fde_encoding = 0;
    uint8_t lsda_encoding = 0;
    bool is_signal_handler = false;
    bool has_augmentation_length = false;
    uint64_t personality_function = 0;
    uint32_t return_address_reg = 0;
  };

  std::unordered_map<const void*, CIEInfo> cie_map;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_entry = remaining;
    string_view entry = sizes.ReadInitialLength(&remaining);
    if (entry.size() == 0 && remaining.size() == 0) {
      return;
    }
    full_entry =
        full_entry.substr(0, entry.size() + (entry.data() - full_entry.data()));
    uint32_t id = ReadFixed<uint32_t>(&entry);
    if (id == 0) {
      // CIE, we don't attribute this yet.
      CIEInfo& cie_info = cie_map[full_entry.data()];
      cie_info.version = ReadFixed<uint8_t>(&entry);
      string_view aug_string = ReadNullTerminated(&entry);
      cie_info.code_align = dwarf::ReadLEB128<uint32_t>(&entry);
      cie_info.data_align = dwarf::ReadLEB128<int32_t>(&entry);
      switch (cie_info.version) {
        case 1:
          cie_info.return_address_reg = ReadFixed<uint8_t>(&entry);
          break;
        case 3:
          cie_info.return_address_reg = dwarf::ReadLEB128<uint32_t>(&entry);
          break;
        default:
          THROW("Unexpected eh_frame CIE version");
      }
      while (aug_string.size() > 0) {
        switch (aug_string[0]) {
          case 'z':
            // Length until the end of augmentation data.
            cie_info.has_augmentation_length = true;
            dwarf::ReadLEB128<uint32_t>(&entry);
            break;
          case 'L':
            cie_info.lsda_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'R':
            cie_info.fde_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'S':
            cie_info.is_signal_handler = true;
            break;
          case 'P': {
            uint8_t encoding = ReadFixed<uint8_t>(&entry);
            cie_info.personality_function =
                ReadEncodedPointer(encoding, true, &entry, nullptr, sink);
            break;
          }
          default:
            THROW("Unexepcted augmentation character");
        }
        aug_string.remove_prefix(1);
      }
    } else {
      auto iter = cie_map.find(entry.data() - id - 4);
      if (iter == cie_map.end()) {
        THROW("Couldn't find CIE for FDE");
      }
      const CIEInfo& cie_info = iter->second;
      // TODO(haberman): don't hard-code 64-bit.
      uint64_t address = ReadEncodedPointer(cie_info.fde_encoding, true, &entry,
                                            nullptr, sink);
      // TODO(haberman); Technically the FDE addresses could span a
      // function/compilation unit?  They can certainly span inlines.
      /*
      uint64_t length =
        ReadEncodedPointer(cie_info.fde_encoding & 0xf, true, &entry, sink);
      (void)length;

      if (cie_info.has_augmentation_length) {
        uint32_t augmentation_length = dwarf::ReadLEB128<uint32_t>(&entry);
        (void)augmentation_length;
      }

      uint64_t lsda =
          ReadEncodedPointer(cie_info.lsda_encoding, true, &entry, sink);
      if (lsda) {
      }
      */

      sink->AddFileRangeForVMAddr("dwarf_fde", address, full_entry);
    }
  }
}